

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O2

err_t botpHOTPRand(char *otp,size_t digit,octet *key,size_t key_len,octet *ctr)

{
  bool_t bVar1;
  size_t size;
  blob_t state;
  err_t eVar2;
  
  eVar2 = 0x1f6;
  if (0xfffffffffffffffc < digit - 9) {
    bVar1 = memIsValid(otp,digit + 1);
    eVar2 = 0x6d;
    if (bVar1 != 0) {
      bVar1 = memIsValid(key,key_len);
      if (bVar1 != 0) {
        bVar1 = memIsValid(ctr,8);
        if (bVar1 != 0) {
          size = botpHOTP_keep();
          state = blobCreate(size);
          if (state == (blob_t)0x0) {
            eVar2 = 0x6e;
          }
          else {
            botpHOTPStart(state,digit,key,key_len);
            botpHOTPStepS(state,ctr);
            botpHOTPStepR(otp,state);
            blobClose(state);
            eVar2 = 0;
          }
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t botpHOTPRand(char* otp, size_t digit, const octet key[], size_t key_len, 
	const octet ctr[8])
{
	void* state;
	// проверить входные данные
	if (digit < 6 || digit > 8)
		return ERR_BAD_PARAMS;
	if (!memIsValid(otp, digit + 1) || 
		!memIsValid(key, key_len) ||
		!memIsValid(ctr, 8))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(botpHOTP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// сгенерировать пароль и изменить счетчик
	botpHOTPStart(state, digit, key, key_len);
	botpHOTPStepS(state, ctr);
	botpHOTPStepR(otp, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}